

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O0

_Bool COSE_Sign0_Sign(HCOSE_SIGN0 h,cn_cbor *pKey,cose_errback *perr)

{
  _Bool _Var1;
  undefined1 local_128 [8];
  eckey_t_conflict eckey;
  _Bool ret;
  cose_errback *perr_local;
  cn_cbor *pKey_local;
  HCOSE_SIGN0 h_local;
  
  eckey.private_Q.private_Z._15_1_ = 0;
  if (pKey == (cn_cbor *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else {
    _Var1 = eckey_from_cbor((eckey_t *)local_128,pKey,perr);
    if (_Var1) {
      eckey.private_Q.private_Z._15_1_ = COSE_Sign0_Sign_eckey(h,(eckey_t_conflict *)local_128,perr)
      ;
    }
    eckey_release((eckey_t *)local_128);
  }
  return (_Bool)(eckey.private_Q.private_Z._15_1_ & 1);
}

Assistant:

bool COSE_Sign0_Sign(HCOSE_SIGN0 h, const cn_cbor * pKey, cose_errback * perr)
{
	bool ret = false;
	eckey_t eckey;

	CHECK_CONDITION(pKey != NULL, COSE_ERR_INVALID_PARAMETER);
	if (eckey_from_cbor(&eckey, pKey, perr))
	{
		ret = COSE_Sign0_Sign_eckey(h, &eckey, perr);
	}

	eckey_release(&eckey);

errorReturn:
	return ret;
}